

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.hpp
# Opt level: O0

Molecule * __thiscall OpenMD::SimInfo::getMoleculeByGlobalIndex(SimInfo *this,int index)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *in_RDI;
  MoleculeIterator i;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *in_stack_ffffffffffffffc8;
  Molecule *pMVar3;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18 [3];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_18);
  local_20 = (_Base_ptr)
             std::
             map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
             ::find(in_stack_ffffffffffffffc8,(key_type *)0x164197);
  local_18[0]._M_node = local_20;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator!=(local_18,&local_28);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::operator->(in_RDI);
    pMVar3 = ppVar2->second;
  }
  else {
    pMVar3 = (Molecule *)0x0;
  }
  return pMVar3;
}

Assistant:

Molecule* getMoleculeByGlobalIndex(int index) {
      MoleculeIterator i;
      i = molecules_.find(index);

      return i != molecules_.end() ? i->second : NULL;
    }